

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  U32 UVar3;
  undefined8 uVar4;
  long lVar5;
  seqStore_t *psVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  BYTE *pBVar11;
  uint uVar12;
  BYTE *pBVar13;
  int *piVar14;
  U32 UVar15;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int *piVar23;
  long lVar24;
  seqDef *psVar25;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_e8;
  ulong local_e0;
  seqStore_t *local_d8;
  BYTE *local_d0;
  BYTE *local_c8;
  int *local_c0;
  uint local_b4;
  int local_b0;
  uint local_ac;
  int *local_a8;
  BYTE *local_a0;
  int *local_98;
  ulong local_90;
  int *local_88;
  int *local_80;
  ulong local_78;
  U32 *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iEnd = (int *)((long)src + srcSize);
  local_c0 = (int *)((long)src + (srcSize - 8));
  local_c8 = (ms->window).base;
  local_d0 = (ms->window).dictBase;
  uVar12 = (ms->window).dictLimit;
  local_e0 = (ulong)uVar12;
  local_a0 = local_c8 + local_e0;
  uVar7 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).windowLog;
  uVar20 = (ms->cParams).minMatch;
  uVar18 = 6;
  if (uVar20 < 6) {
    uVar18 = uVar20;
  }
  local_ac = 4;
  if (4 < uVar18) {
    local_ac = uVar18;
  }
  uVar10 = (ulong)*rep;
  uVar20 = rep[1];
  uVar21 = (ulong)uVar20;
  ms->lazySkipping = 0;
  piVar23 = (int *)((ulong)(local_a0 == (BYTE *)src) + (long)src);
  local_70 = rep;
  if (piVar23 < local_c0) {
    local_98 = (int *)(local_d0 + local_e0);
    local_50 = local_d0 + uVar7;
    uVar7 = 1 << ((byte)uVar2 & 0x1f);
    local_90 = (ulong)uVar7;
    local_b0 = uVar12 - 1;
    local_88 = iEnd + -8;
    iVar8 = (int)local_c8;
    local_60 = (ulong)(1 - (uVar7 + iVar8));
    local_58 = (ulong)(1 - iVar8);
    local_68 = (ulong)((uVar12 + iVar8) - 2);
    local_d8 = seqStore;
    do {
      local_b4 = (uint)uVar21;
      iVar22 = (int)piVar23;
      iVar8 = (iVar22 - (int)local_c8) + 1;
      UVar3 = (ms->window).lowLimit;
      UVar15 = iVar8 - (uint)local_90;
      if (iVar8 - UVar3 <= (uint)local_90) {
        UVar15 = UVar3;
      }
      if (ms->loadedDictEnd != 0) {
        UVar15 = UVar3;
      }
      uVar12 = iVar8 - (uint)uVar10;
      pBVar13 = local_c8;
      if (uVar12 < (uint)local_e0) {
        pBVar13 = local_d0;
      }
      local_78 = uVar10;
      if (local_b0 - uVar12 < 3) {
LAB_001524ac:
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if ((uint)uVar10 <= iVar8 - UVar15) {
          if (*(int *)((long)piVar23 + 1) != *(int *)(pBVar13 + uVar12)) goto LAB_001524ac;
          piVar14 = iEnd;
          if (uVar12 < (uint)local_e0) {
            piVar14 = local_98;
          }
          sVar9 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar23 + 5),(BYTE *)((long)(pBVar13 + uVar12) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar14,local_a0);
          uVar21 = sVar9 + 4;
        }
      }
      local_e8 = 999999999;
      if (local_ac == 6) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar23,(BYTE *)iEnd,&local_e8);
      }
      else if (local_ac == 5) {
        uVar10 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar23,(BYTE *)iEnd,&local_e8);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar23,(BYTE *)iEnd,&local_e8);
      }
      uVar17 = uVar21;
      if (uVar21 < uVar10) {
        uVar17 = uVar10;
      }
      if (uVar17 < 4) {
        uVar21 = (long)piVar23 - (long)src;
        piVar23 = (int *)((long)piVar23 + (uVar21 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar21);
        uVar10 = local_78;
        uVar21 = (ulong)local_b4;
      }
      else {
        piVar14 = piVar23;
        uVar19 = local_e8;
        if (uVar10 <= uVar21) {
          piVar14 = (int *)((long)piVar23 + 1);
          uVar19 = 1;
        }
        if (piVar23 < local_c0) {
          local_38 = (ulong)(uint)((int)local_60 + iVar22);
          uVar12 = (int)local_58 + iVar22;
          local_40 = (ulong)uVar12;
          uVar7 = ((int)local_68 + (int)local_78) - iVar22;
          local_48 = (ulong)(uVar12 - (int)local_78);
          lVar24 = 0;
          local_80 = piVar23;
          do {
            local_a8 = (int *)((long)local_80 + lVar24 + 1);
            piVar23 = local_a8;
            if (uVar19 == 0) {
              uVar19 = 0;
            }
            else {
              UVar3 = (ms->window).lowLimit;
              iVar22 = (int)lVar24;
              iVar8 = (int)local_40 + iVar22;
              UVar15 = (int)local_38 + iVar22;
              if (iVar8 - UVar3 <= (uint)local_90) {
                UVar15 = UVar3;
              }
              if (ms->loadedDictEnd != 0) {
                UVar15 = UVar3;
              }
              uVar12 = (int)local_48 + iVar22;
              pBVar13 = local_c8;
              if (uVar12 < (uint)local_e0) {
                pBVar13 = local_d0;
              }
              if (((2 < uVar7) && ((uint)local_78 <= iVar8 - UVar15)) &&
                 (*local_a8 == *(int *)(pBVar13 + uVar12))) {
                piVar23 = iEnd;
                if (uVar12 < (uint)local_e0) {
                  piVar23 = local_98;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)local_80 + lVar24 + 5),
                                   (BYTE *)((long)(pBVar13 + uVar12) + 4),(BYTE *)iEnd,
                                   (BYTE *)piVar23,local_a0);
                piVar23 = local_a8;
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar12 = 0x1f;
                  if ((uint)uVar19 != 0) {
                    for (; (uint)uVar19 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                    }
                  }
                  if ((int)((uVar12 ^ 0x1f) + (int)uVar17 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                    uVar19 = 1;
                    uVar17 = sVar9 + 4;
                    piVar14 = local_a8;
                  }
                }
              }
            }
            local_e8 = 999999999;
            local_a8 = piVar14;
            if (local_ac == 6) {
              uVar21 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar23,(BYTE *)iEnd,&local_e8);
            }
            else if (local_ac == 5) {
              uVar21 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar23,(BYTE *)iEnd,&local_e8);
            }
            else {
              uVar21 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar23,(BYTE *)iEnd,&local_e8);
            }
            piVar14 = local_a8;
            if (uVar21 < 4) goto LAB_00152784;
            uVar12 = 0x1f;
            if ((uint)uVar19 != 0) {
              for (; (uint)uVar19 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            iVar8 = 0x1f;
            if ((uint)local_e8 != 0) {
              for (; (uint)local_e8 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            if ((int)uVar21 * 4 - iVar8 <= (int)((uVar12 ^ 0x1f) + (int)uVar17 * 4 + -0x1b))
            goto LAB_00152784;
            lVar5 = lVar24 + 1;
            lVar24 = lVar24 + 1;
            uVar7 = uVar7 - 1;
            uVar17 = uVar21;
            uVar19 = local_e8;
            piVar14 = piVar23;
          } while ((int *)((long)local_80 + lVar5) < local_c0);
          piVar14 = (int *)((long)local_80 + lVar24);
        }
LAB_00152784:
        uVar10 = local_78;
        uVar12 = local_b4;
        if (3 < uVar19) {
          pcVar16 = (char *)((long)piVar14 + (3 - (long)(local_c8 + uVar19)));
          pBVar11 = local_a0;
          pBVar13 = local_c8;
          if ((uint)pcVar16 < (uint)local_e0) {
            pBVar11 = local_50;
            pBVar13 = local_d0;
          }
          if ((src < piVar14) && (uVar21 = (ulong)pcVar16 & 0xffffffff, pBVar11 < pBVar13 + uVar21))
          {
            pBVar13 = pBVar13 + uVar21;
            do {
              piVar23 = (int *)((long)piVar14 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar23 != *pBVar13) ||
                 (uVar17 = uVar17 + 1, piVar14 = piVar23, piVar23 <= src)) break;
            } while (pBVar11 < pBVar13);
          }
          uVar12 = (uint)local_78;
          uVar10 = (ulong)((U32)uVar19 - 3);
        }
        if (local_d8->maxNbSeq <=
            (ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart >> 3)) {
LAB_00152bd0:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_d8->maxNbLit) {
LAB_00152bb1:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar21 = (long)piVar14 - (long)src;
        pBVar13 = local_d8->lit;
        if (local_d8->litStart + local_d8->maxNbLit < pBVar13 + uVar21) {
LAB_00152bef:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar14) {
LAB_00152c0e:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_88 < piVar14) {
          ZSTD_safecopyLiterals(pBVar13,(BYTE *)src,(BYTE *)piVar14,(BYTE *)local_88);
LAB_00152887:
          local_d8->lit = local_d8->lit + uVar21;
          if (0xffff < uVar21) {
            if (local_d8->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_d8->longLengthType = ZSTD_llt_literalLength;
            local_d8->longLengthPos =
                 (U32)((ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar13 = *src;
          *(undefined8 *)(pBVar13 + 8) = uVar4;
          pBVar13 = local_d8->lit;
          if (0x10 < uVar21) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar13 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar13 + 0x18) = uVar4;
            if (0x20 < (long)uVar21) {
              lVar24 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar24 + 0x20);
                uVar4 = puVar1[1];
                pBVar11 = pBVar13 + lVar24 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar24 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar4;
                lVar24 = lVar24 + 0x20;
              } while (pBVar11 + 0x20 < pBVar13 + uVar21);
            }
            goto LAB_00152887;
          }
          local_d8->lit = pBVar13 + uVar21;
        }
        psVar25 = local_d8->sequences;
        psVar25->litLength = (U16)uVar21;
        psVar25->offBase = (U32)uVar19;
        if (uVar17 < 3) {
LAB_00152b92:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar21 = (ulong)uVar12;
        if (0xffff < uVar17 - 3) {
          if (local_d8->longLengthType != ZSTD_llt_none) {
LAB_00152c2d:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_d8->longLengthType = ZSTD_llt_matchLength;
          local_d8->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)local_d8->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(uVar17 - 3);
        psVar25 = psVar25 + 1;
        local_d8->sequences = psVar25;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar23 = (int *)((long)piVar14 + uVar17);
        src = piVar23;
        if (piVar23 <= local_c0) {
          uVar17 = uVar10 & 0xffffffff;
          do {
            uVar19 = uVar21;
            uVar10 = uVar17;
            iVar8 = (int)piVar23 - (int)local_c8;
            UVar3 = (ms->window).lowLimit;
            UVar15 = iVar8 - (uint)local_90;
            if (iVar8 - UVar3 <= (uint)local_90) {
              UVar15 = UVar3;
            }
            if (ms->loadedDictEnd != 0) {
              UVar15 = UVar3;
            }
            uVar12 = iVar8 - (uint)uVar19;
            pBVar13 = local_c8;
            if (uVar12 < (uint)local_e0) {
              pBVar13 = local_d0;
            }
            uVar21 = uVar19;
            src = piVar23;
            if (((local_b0 - uVar12 < 3) || (iVar8 - UVar15 < (uint)uVar19)) ||
               (*piVar23 != *(int *)(pBVar13 + uVar12))) break;
            piVar14 = iEnd;
            if (uVar12 < (uint)local_e0) {
              piVar14 = local_98;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar23 + 1),(BYTE *)((long)(pBVar13 + uVar12) + 4),
                               (BYTE *)iEnd,(BYTE *)piVar14,local_a0);
            psVar6 = local_d8;
            if (local_d8->maxNbSeq <= (ulong)((long)psVar25 - (long)local_d8->sequencesStart >> 3))
            goto LAB_00152bd0;
            if (0x20000 < local_d8->maxNbLit) goto LAB_00152bb1;
            pBVar13 = local_d8->lit;
            if (local_d8->litStart + local_d8->maxNbLit < pBVar13) goto LAB_00152bef;
            if (iEnd < piVar23) goto LAB_00152c0e;
            if (local_88 < piVar23) {
              ZSTD_safecopyLiterals(pBVar13,(BYTE *)piVar23,(BYTE *)piVar23,(BYTE *)local_88);
            }
            else {
              uVar4 = *(undefined8 *)(piVar23 + 2);
              *(undefined8 *)pBVar13 = *(undefined8 *)piVar23;
              *(undefined8 *)(pBVar13 + 8) = uVar4;
            }
            psVar25 = psVar6->sequences;
            psVar25->litLength = 0;
            psVar25->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_00152b92;
            if (0xffff < sVar9 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_00152c2d;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar25 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar25->mlBase = (U16)(sVar9 + 1);
            psVar25 = psVar25 + 1;
            psVar6->sequences = psVar25;
            piVar23 = (int *)((long)piVar23 + sVar9 + 4);
            uVar17 = uVar19;
            uVar21 = uVar10;
            uVar10 = uVar19;
            src = piVar23;
          } while (piVar23 <= local_c0);
        }
      }
      uVar20 = (uint)uVar21;
    } while (piVar23 < local_c0);
  }
  *local_70 = (U32)uVar10;
  local_70[1] = uVar20;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}